

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

int SetUserCVar(int playernum,char *cvarname,int value,bool is_string)

{
  ulong uVar1;
  long *plVar2;
  uint uVar3;
  FBaseCVar *pFVar4;
  long *plVar5;
  int iVar6;
  int iVar7;
  
  iVar6 = 0;
  iVar7 = 0;
  if (((uint)playernum < 8) &&
     (uVar1 = (ulong)(uint)playernum, iVar7 = iVar6, playeringame[uVar1] == true)) {
    uVar3 = FName::NameManager::FindName(&FName::NameData,cvarname,true);
    plVar2 = (long *)((ulong)((&DAT_00a602d8)[uVar1 * 0xa8] - 1 & uVar3) * 0x18 +
                     (&DAT_00a602c8)[uVar1 * 0x54]);
    do {
      plVar5 = plVar2;
      if (plVar5 == (long *)0x0) {
        return 0;
      }
      if ((long *)*plVar5 == (long *)0x1) {
        return 0;
      }
      plVar2 = (long *)*plVar5;
    } while (*(uint *)(plVar5 + 1) != uVar3);
    pFVar4 = (FBaseCVar *)plVar5[2];
    if ((pFVar4 != (FBaseCVar *)0x0) && ((pFVar4->Flags & 0x6000) == 0x2000)) {
      DoSetCVar(pFVar4,value,is_string,false);
      iVar7 = 1;
      if ((consoleplayer == playernum) &&
         (pFVar4 = FindCVar(cvarname,(FBaseCVar **)0x0), pFVar4 != (FBaseCVar *)0x0)) {
        iVar7 = 1;
        DoSetCVar(pFVar4,value,is_string,true);
      }
    }
  }
  return iVar7;
}

Assistant:

static int SetUserCVar(int playernum, const char *cvarname, int value, bool is_string)
{
	if ((unsigned)playernum >= MAXPLAYERS || !playeringame[playernum])
	{
		return 0;
	}
	FBaseCVar **cvar_p = players[playernum].userinfo.CheckKey(FName(cvarname, true));
	FBaseCVar *cvar;
	// Only mod-created cvars may be set.
	if (cvar_p == NULL || (cvar = *cvar_p) == NULL || (cvar->GetFlags() & CVAR_IGNORE) || !(cvar->GetFlags() & CVAR_MOD))
	{
		return 0;
	}
	DoSetCVar(cvar, value, is_string);

	// If we are this player, then also reflect this change in the local version of this cvar.
	if (playernum == consoleplayer)
	{
		FBaseCVar *cvar = FindCVar(cvarname, NULL);
		// If we can find it in the userinfo, then we should also be able to find it in the normal cvar list,
		// but check just to be safe.
		if (cvar != NULL)
		{
			DoSetCVar(cvar, value, is_string, true);
		}
	}

	return 1;
}